

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_coroutine_status(lua_State *L)

{
  long in_RDI;
  lua_State *co;
  char *s;
  undefined8 in_stack_ffffffffffffffe8;
  lua_State *in_stack_fffffffffffffff0;
  
  if ((*(ulong *)(in_RDI + 0x10) < *(ulong *)(in_RDI + 0x18)) &&
     (*(int *)(*(long *)(in_RDI + 0x10) + 4) == -7)) {
    lua_pushstring((lua_State *)s,(char *)co);
    return 1;
  }
  lj_err_arg(in_stack_fffffffffffffff0,(int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
             (ErrMsg)in_stack_ffffffffffffffe8);
}

Assistant:

LJLIB_CF(coroutine_status)
{
  const char *s;
  lua_State *co;
  if (!(L->top > L->base && tvisthread(L->base)))
    lj_err_arg(L, 1, LJ_ERR_NOCORO);
  co = threadV(L->base);
  if (co == L) s = "running";
  else if (co->status == LUA_YIELD) s = "suspended";
  else if (co->status != 0) s = "dead";
  else if (co->base > tvref(co->stack)+1) s = "normal";
  else if (co->top == co->base) s = "dead";
  else s = "suspended";
  lua_pushstring(L, s);
  return 1;
}